

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall CheaterBotStrategy::cheaterFortify(CheaterBotStrategy *this)

{
  Country *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  reference ppCVar7;
  PlayerStrategy *pPVar8;
  string local_78;
  Country *local_58;
  Country *neighbour;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  bool canFortify;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  CheaterBotStrategy *this_local;
  
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "We have a cheater! They are fortifying all their countries with enemy neighbours"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pvVar6 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&country);
    if (!bVar1) break;
    ppCVar7 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppCVar7;
    bVar1 = false;
    pvVar6 = Map::Country::getAdjCountries(this_00);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
    neighbour = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6)
    ;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                  *)&neighbour);
      if (!bVar2) break;
      ppCVar7 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2);
      local_58 = *ppCVar7;
      iVar4 = Map::Country::getPlayerOwnerID(local_58);
      iVar3 = Map::Country::getPlayerOwnerID(this_00);
      if (iVar4 != iVar3) {
        bVar1 = true;
      }
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[CHEATER] - Country ");
      Map::Country::getCountryName_abi_cxx11_(&local_78,this_00);
      poVar5 = std::operator<<(poVar5,(string *)&local_78);
      poVar5 = std::operator<<(poVar5," had ");
      iVar4 = Map::Country::getNumberOfTroops(this_00);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      std::operator<<(poVar5," armies. It now has ");
      std::__cxx11::string::~string((string *)&local_78);
      iVar4 = Map::Country::getNumberOfTroops(this_00);
      if (0 < iVar4 * 2) {
        iVar4 = Map::Country::getNumberOfTroops(this_00);
        if (iVar4 * 2 < 0x7fffffff) {
          iVar4 = Map::Country::getNumberOfTroops(this_00);
          Map::Country::setNumberOfTroops(this_00,iVar4 << 1);
        }
      }
      iVar4 = Map::Country::getNumberOfTroops(this_00);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
      poVar5 = std::operator<<(poVar5," armies. -");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  }
  Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
  pPVar8 = Player::getStrategy((this->super_PlayerStrategy).player);
  (*pPVar8->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterFortify() {
    std::cout << "We have a cheater! They are fortifying all their countries with enemy neighbours" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        bool canFortify = false;
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                canFortify = true;
            }
        }
        if (canFortify) {
            std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
            //prevent overflow
            if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
                country->setNumberOfTroops(country->getNumberOfTroops() * 2);
            }
            std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}